

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O3

TPZElementMatrix * __thiscall
TPZStack<TPZElementMatrix_*,_10>::Pop(TPZStack<TPZElementMatrix_*,_10> *this)

{
  long lVar1;
  
  lVar1 = (this->super_TPZManVector<TPZElementMatrix_*,_10>).super_TPZVec<TPZElementMatrix_*>.
          fNElements;
  (this->super_TPZManVector<TPZElementMatrix_*,_10>).super_TPZVec<TPZElementMatrix_*>.fNElements =
       lVar1 + -1;
  if (0 < lVar1) {
    return (this->super_TPZManVector<TPZElementMatrix_*,_10>).super_TPZVec<TPZElementMatrix_*>.
           fStore[lVar1 + -1];
  }
  (this->super_TPZManVector<TPZElementMatrix_*,_10>).super_TPZVec<TPZElementMatrix_*>.fNElements = 0
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZStack popping beyond the stack object",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return (TPZElementMatrix *)0x0;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}